

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_sections(BinBinaryWriter *this,Bin *bin)

{
  bool bVar1;
  const_iterator cVar2;
  char *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_49;
  key_type local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"type",&local_49);
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)bin,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    msg = "type_section != bin.sections.end()\n";
  }
  else if (*(char *)((long)cVar2.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
                           ._M_cur + 0x68) == '\x10') {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
                   ._M_cur + 0x28);
    bVar1 = std::operator==(__lhs,"PROP");
    if ((bVar1) || (bVar1 = std::operator==(__lhs,"PTCH"), bVar1)) {
      bVar1 = std::operator==(__lhs,"PTCH");
      if (bVar1) {
        local_48._M_dataplus._M_p._0_4_ = 0x48435450;
        BinaryWriter::write<char,4ul>(&this->writer,(array<char,_4UL> *)&local_48);
        BinaryWriter::write<unsigned_int>(&this->writer,1);
        BinaryWriter::write<unsigned_int>(&this->writer,0);
      }
      local_48._M_dataplus._M_p._0_4_ = 0x504f5250;
      BinaryWriter::write<char,4ul>(&this->writer,(array<char,_4UL> *)&local_48);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"version",&local_49);
      cVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)bin,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        msg = "version_section != bin.sections.end()\n";
      }
      else if (*(char *)((long)cVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
                               ._M_cur + 0x68) == '\a') {
        BinaryWriter::write<unsigned_int>
                  (&this->writer,
                   *(uint *)((long)cVar2.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
                                   ._M_cur + 0x28));
        if ((*(uint *)((long)cVar2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
                             ._M_cur + 0x28) < 2) || (bVar1 = write_links(this,bin), bVar1)) {
          bVar1 = write_entries(this,bin);
          if (bVar1) {
            if (*(uint *)((long)cVar2.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>,_true>
                                ._M_cur + 0x28) < 3) {
              return true;
            }
            bVar1 = std::operator==(__lhs,"PTCH");
            if (!bVar1) {
              return true;
            }
            bVar1 = write_patches(this,bin);
            if (bVar1) {
              return true;
            }
            msg = "write_patches(bin)\n";
          }
          else {
            msg = "write_entries(bin)\n";
          }
        }
        else {
          msg = "write_links(bin)\n";
        }
      }
      else {
        msg = "version\n";
      }
    }
    else {
      msg = "type->value == \"PROP\" || type->value == \"PTCH\"\n";
    }
  }
  else {
    msg = "type\n";
  }
  bVar1 = fail_msg(this,msg);
  return bVar1;
}

Assistant:

bool write_sections(Bin const& bin) noexcept {
            auto type_section = bin.sections.find("type");
            bin_assert(type_section != bin.sections.end());
            auto type = std::get_if<String>(&type_section->second);
            bin_assert(type);
            bin_assert(type->value == "PROP" || type->value == "PTCH");
            if (type->value == "PTCH") {
                writer.write(std::array{ 'P', 'T', 'C', 'H' });
                writer.write(uint32_t{ 1 });
                writer.write(uint32_t{ 0 });
            }
            writer.write(std::array{ 'P', 'R', 'O', 'P' });


            auto version_section = bin.sections.find("version");
            bin_assert(version_section != bin.sections.end());
            auto version = std::get_if<U32>(&version_section->second);
            bin_assert(version);
            writer.write(uint32_t{ version->value });

            if (version->value >= 2) {
                bin_assert(write_links(bin));
            }
            bin_assert(write_entries(bin));
            if (version->value >= 3 && type->value == "PTCH") {
                bin_assert(write_patches(bin));
            }

            return true;
        }